

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmn.h
# Opt level: O1

int jsmn_parse(jsmn_parser *parser,char *js,size_t len,jsmntok_t *tokens,uint num_tokens)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  int iVar8;
  jsmntok_t *pjVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong unaff_R13;
  uint uVar16;
  uint uVar17;
  int local_3c;
  
  uVar15 = parser->pos;
  uVar12 = parser->toknext;
joined_r0x001060d4:
  uVar10 = (ulong)uVar15;
  if (len <= uVar10) {
LAB_0010658a:
    if ((tokens != (jsmntok_t *)0x0) && (uVar15 = parser->toknext - 1, -1 < (int)uVar15)) {
      piVar7 = &tokens[uVar15].end;
      lVar5 = (ulong)uVar15 + 1;
      do {
        if ((piVar7[-1] != -1) && (*piVar7 == -1)) {
          return -3;
        }
        piVar7 = piVar7 + -4;
        lVar6 = lVar5 + -1;
        bVar3 = 0 < lVar5;
        lVar5 = lVar6;
      } while (lVar6 != 0 && bVar3);
    }
    return uVar12;
  }
  bVar1 = js[uVar10];
  unaff_R13 = CONCAT71((int7)(unaff_R13 >> 8),bVar1);
  bVar3 = true;
  uVar14 = (uint)bVar1;
  if (0x2b < uVar14) {
    if (uVar14 < 0x5d) {
      if (uVar14 == 0x2c) {
        if ((((tokens != (jsmntok_t *)0x0) && ((long)parser->toksuper != -1)) &&
            (1 < tokens[parser->toksuper].type - JSMN_OBJECT)) &&
           (uVar14 = parser->toknext - 1, -1 < (int)uVar14)) {
          piVar7 = &tokens[uVar14].end;
          uVar10 = (ulong)uVar14;
          do {
            if (((((jsmntok_t *)(piVar7 + -2))->type - JSMN_OBJECT < 2) && (piVar7[-1] != -1)) &&
               (*piVar7 == -1)) goto LAB_00106533;
            piVar7 = piVar7 + -4;
            bVar4 = 0 < (long)uVar10;
            uVar10 = uVar10 - 1;
          } while (bVar4);
        }
      }
      else {
        if (bVar1 != 0x3a) {
          if (bVar1 != 0x5b) goto LAB_001062ff;
LAB_0010636f:
          uVar12 = uVar12 + 1;
          if (tokens == (jsmntok_t *)0x0) goto LAB_00106573;
          uVar14 = parser->toknext;
          if (uVar14 < num_tokens) {
            parser->toknext = uVar14 + 1;
            pjVar9 = tokens + uVar14;
            tokens[uVar14].start = -1;
            tokens[uVar14].end = -1;
            tokens[uVar14].size = 0;
          }
          else {
            pjVar9 = (jsmntok_t *)0x0;
          }
          if (pjVar9 == (jsmntok_t *)0x0) {
            local_3c = -1;
            goto LAB_001064de;
          }
          if ((long)parser->toksuper != -1) {
            tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
          }
          pjVar9->type = (bVar1 != 0x7b) + JSMN_OBJECT;
          pjVar9->start = uVar15;
        }
        parser->toksuper = parser->toknext - 1;
      }
    }
    else {
      if (bVar1 != 0x5d) {
        if (bVar1 == 0x7b) goto LAB_0010636f;
        if (uVar14 != 0x7d) goto LAB_001062ff;
      }
      if (tokens != (jsmntok_t *)0x0) {
        uVar10 = (ulong)parser->toknext;
        uVar14 = parser->toknext - 1;
        unaff_R13 = (ulong)uVar14;
        if (-1 < (int)uVar14) {
          piVar7 = &tokens[uVar14].end;
          uVar10 = (ulong)uVar14 + 1;
          do {
            if ((piVar7[-1] != -1) && (*piVar7 == -1)) {
              if (((jsmntok_t *)(piVar7 + -2))->type != (bVar1 != 0x7d) + JSMN_OBJECT)
              goto LAB_001064d6;
              unaff_R13 = (ulong)((int)uVar10 - 1);
              parser->toksuper = -1;
              *piVar7 = uVar15 + 1;
              goto LAB_00106498;
            }
            piVar7 = piVar7 + -4;
            uVar11 = uVar10 - 1;
            bVar4 = 0 < (long)uVar10;
            uVar10 = uVar11;
          } while (uVar11 != 0 && bVar4);
          uVar10 = 0;
          unaff_R13 = 0xffffffff;
        }
LAB_00106498:
        if ((int)uVar10 == 0) {
LAB_001064d6:
          local_3c = -2;
LAB_001064de:
          bVar3 = false;
        }
        else if (-1 < (int)unaff_R13) {
          piVar7 = &tokens[unaff_R13].end;
          uVar10 = unaff_R13;
          do {
            if ((piVar7[-1] != -1) && (*piVar7 == -1)) goto LAB_00106533;
            piVar7 = piVar7 + -4;
            bVar4 = 0 < (long)uVar10;
            uVar10 = uVar10 - 1;
          } while (bVar4);
        }
      }
    }
    goto LAB_00106573;
  }
  if (uVar14 < 0xd) {
    if (uVar14 - 9 < 2) goto LAB_00106573;
    if (bVar1 == 0) goto LAB_0010658a;
LAB_001062ff:
    do {
      uVar14 = (uint)uVar10;
      bVar1 = js[uVar10];
      if ((((ulong)bVar1 < 0x3b) && ((0x400100100002601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
         ((bVar1 == 0x5d || (bVar1 == 0x7d)))) break;
      if ((byte)(bVar1 + 0x81) < 0xa1) {
        iVar8 = -2;
        goto LAB_0010653d;
      }
      uVar14 = uVar14 + 1;
      uVar10 = (ulong)uVar14;
      parser->pos = uVar14;
    } while (uVar10 < len);
    if (tokens == (jsmntok_t *)0x0) {
LAB_00106504:
      uVar15 = uVar14 - 1;
      bVar4 = false;
      iVar8 = 0;
    }
    else {
      uVar17 = parser->toknext;
      if (uVar17 < num_tokens) {
        parser->toknext = uVar17 + 1;
        pjVar9 = tokens + uVar17;
        tokens[uVar17].start = -1;
        tokens[uVar17].end = -1;
        tokens[uVar17].size = 0;
      }
      else {
        pjVar9 = (jsmntok_t *)0x0;
      }
      if (pjVar9 != (jsmntok_t *)0x0) {
        pjVar9->type = JSMN_PRIMITIVE;
        pjVar9->start = uVar15;
        pjVar9->end = uVar14;
        pjVar9->size = 0;
        goto LAB_00106504;
      }
      iVar8 = -1;
LAB_0010653d:
      bVar4 = true;
    }
    parser->pos = uVar15;
    if (bVar4) {
      bVar3 = false;
      local_3c = iVar8;
      goto LAB_00106573;
    }
  }
  else {
    if ((bVar1 == 0xd) || (bVar1 == 0x20)) goto LAB_00106573;
    if (uVar14 != 0x22) goto LAB_001062ff;
    uVar14 = uVar15 + 1;
    parser->pos = uVar14;
    if (uVar14 < len) {
      uVar10 = (ulong)uVar14;
      do {
        uVar17 = (uint)uVar10;
        cVar2 = js[uVar10];
        if (cVar2 == '\"') {
          if (tokens != (jsmntok_t *)0x0) {
            uVar16 = parser->toknext;
            if (uVar16 < num_tokens) {
              parser->toknext = uVar16 + 1;
              pjVar9 = tokens + uVar16;
              tokens[uVar16].start = -1;
              tokens[uVar16].end = -1;
              tokens[uVar16].size = 0;
            }
            else {
              pjVar9 = (jsmntok_t *)0x0;
            }
            if (pjVar9 == (jsmntok_t *)0x0) {
              parser->pos = uVar15;
              unaff_R13 = 0xffffffff;
LAB_0010621f:
              bVar4 = false;
              uVar17 = uVar15;
              goto LAB_00106243;
            }
            pjVar9->type = JSMN_STRING;
            pjVar9->start = uVar14;
            pjVar9->end = uVar17;
            pjVar9->size = 0;
          }
          unaff_R13 = 0;
          bVar4 = false;
        }
        else {
          bVar4 = true;
          if (cVar2 == '\\') {
            uVar16 = uVar17 + 1;
            if (uVar16 < len) {
              parser->pos = uVar16;
              uVar13 = (byte)js[uVar16] - 0x62;
              uVar17 = uVar16;
              if (((0x12 < uVar13) || ((0x51011U >> (uVar13 & 0x1f) & 1) == 0)) &&
                 ((uVar16 = (byte)js[uVar16] - 0x22, 0x3a < uVar16 ||
                  ((0x400000000002001U >> ((ulong)uVar16 & 0x3f) & 1) == 0)))) {
                parser->pos = uVar15;
                unaff_R13 = 0xfffffffe;
                goto LAB_0010621f;
              }
            }
          }
          else if (cVar2 == '\0') break;
        }
LAB_00106243:
        if (!bVar4) goto LAB_00106514;
        uVar10 = (ulong)(uVar17 + 1);
        parser->pos = uVar17 + 1;
      } while (uVar10 < len);
    }
    parser->pos = uVar15;
    unaff_R13 = 0xfffffffd;
    uVar17 = uVar15;
LAB_00106514:
    uVar15 = uVar17;
    if ((int)unaff_R13 < 0) {
      bVar3 = false;
      local_3c = (int)unaff_R13;
      goto LAB_00106573;
    }
  }
  uVar12 = uVar12 + 1;
  if ((long)parser->toksuper != -1 && tokens != (jsmntok_t *)0x0) {
    tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
  }
LAB_00106573:
  if (!bVar3) {
    return local_3c;
  }
  uVar15 = uVar15 + 1;
  parser->pos = uVar15;
  goto joined_r0x001060d4;
LAB_00106533:
  parser->toksuper = (int)uVar10;
  goto LAB_00106573;
}

Assistant:

JSMN_API int jsmn_parse(jsmn_parser *parser, const char *js, const size_t len,
                        jsmntok_t *tokens, const unsigned int num_tokens) {
  int r;
  int i;
  jsmntok_t *token;
  int count = parser->toknext;

  for (; parser->pos < len && js[parser->pos] != '\0'; parser->pos++) {
    char c;
    jsmntype_t type;

    c = js[parser->pos];
    switch (c) {
    case '{':
    case '[':
      count++;
      if (tokens == NULL) {
        break;
      }
      token = jsmn_alloc_token(parser, tokens, num_tokens);
      if (token == NULL) {
        return JSMN_ERROR_NOMEM;
      }
      if (parser->toksuper != -1) {
        jsmntok_t *t = &tokens[parser->toksuper];
#ifdef JSMN_STRICT
        /* In strict mode an object or array can't become a key */
        if (t->type == JSMN_OBJECT) {
          return JSMN_ERROR_INVAL;
        }
#endif
        t->size++;
#ifdef JSMN_PARENT_LINKS
        token->parent = parser->toksuper;
#endif
      }
      token->type = (c == '{' ? JSMN_OBJECT : JSMN_ARRAY);
      token->start = parser->pos;
      parser->toksuper = parser->toknext - 1;
      break;
    case '}':
    case ']':
      if (tokens == NULL) {
        break;
      }
      type = (c == '}' ? JSMN_OBJECT : JSMN_ARRAY);
#ifdef JSMN_PARENT_LINKS
      if (parser->toknext < 1) {
        return JSMN_ERROR_INVAL;
      }
      token = &tokens[parser->toknext - 1];
      for (;;) {
        if (token->start != -1 && token->end == -1) {
          if (token->type != type) {
            return JSMN_ERROR_INVAL;
          }
          token->end = parser->pos + 1;
          parser->toksuper = token->parent;
          break;
        }
        if (token->parent == -1) {
          if (token->type != type || parser->toksuper == -1) {
            return JSMN_ERROR_INVAL;
          }
          break;
        }
        token = &tokens[token->parent];
      }
#else
      for (i = parser->toknext - 1; i >= 0; i--) {
        token = &tokens[i];
        if (token->start != -1 && token->end == -1) {
          if (token->type != type) {
            return JSMN_ERROR_INVAL;
          }
          parser->toksuper = -1;
          token->end = parser->pos + 1;
          break;
        }
      }
      /* Error if unmatched closing bracket */
      if (i == -1) {
        return JSMN_ERROR_INVAL;
      }
      for (; i >= 0; i--) {
        token = &tokens[i];
        if (token->start != -1 && token->end == -1) {
          parser->toksuper = i;
          break;
        }
      }
#endif
      break;
    case '\"':
      r = jsmn_parse_string(parser, js, len, tokens, num_tokens);
      if (r < 0) {
        return r;
      }
      count++;
      if (parser->toksuper != -1 && tokens != NULL) {
        tokens[parser->toksuper].size++;
      }
      break;
    case '\t':
    case '\r':
    case '\n':
    case ' ':
      break;
    case ':':
      parser->toksuper = parser->toknext - 1;
      break;
    case ',':
      if (tokens != NULL && parser->toksuper != -1 &&
          tokens[parser->toksuper].type != JSMN_ARRAY &&
          tokens[parser->toksuper].type != JSMN_OBJECT) {
#ifdef JSMN_PARENT_LINKS
        parser->toksuper = tokens[parser->toksuper].parent;
#else
        for (i = parser->toknext - 1; i >= 0; i--) {
          if (tokens[i].type == JSMN_ARRAY || tokens[i].type == JSMN_OBJECT) {
            if (tokens[i].start != -1 && tokens[i].end == -1) {
              parser->toksuper = i;
              break;
            }
          }
        }
#endif
      }
      break;
#ifdef JSMN_STRICT
    /* In strict mode primitives are: numbers and booleans */
    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
    case 't':
    case 'f':
    case 'n':
      /* And they must not be keys of the object */
      if (tokens != NULL && parser->toksuper != -1) {
        const jsmntok_t *t = &tokens[parser->toksuper];
        if (t->type == JSMN_OBJECT ||
            (t->type == JSMN_STRING && t->size != 0)) {
          return JSMN_ERROR_INVAL;
        }
      }
#else
    /* In non-strict mode every unquoted value is a primitive */
    default:
#endif
      r = jsmn_parse_primitive(parser, js, len, tokens, num_tokens);
      if (r < 0) {
        return r;
      }
      count++;
      if (parser->toksuper != -1 && tokens != NULL) {
        tokens[parser->toksuper].size++;
      }
      break;

#ifdef JSMN_STRICT
    /* Unexpected char in strict mode */
    default:
      return JSMN_ERROR_INVAL;
#endif
    }
  }

  if (tokens != NULL) {
    for (i = parser->toknext - 1; i >= 0; i--) {
      /* Unmatched opened object or array */
      if (tokens[i].start != -1 && tokens[i].end == -1) {
        return JSMN_ERROR_PART;
      }
    }
  }

  return count;
}